

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QByteArray * QtPrivate::convertToUtf8(QByteArray *__return_storage_ptr__,QLatin1StringView string)

{
  QUtf8 *this;
  char *pcVar1;
  char *pcVar2;
  char *in_RCX;
  __off_t __length;
  QLatin1StringView in;
  
  in.m_size = string.m_data;
  if (in.m_size == (char *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(__return_storage_ptr__,(long)string.m_size * 2,Uninitialized);
    this = (QUtf8 *)QByteArray::data(__return_storage_ptr__);
    in.m_data = in_RCX;
    pcVar1 = QUtf8::convertFromLatin1(this,(char *)string.m_size,in);
    pcVar2 = QByteArray::data(__return_storage_ptr__);
    QByteArray::truncate(__return_storage_ptr__,pcVar1 + -(long)pcVar2,__length);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QtPrivate::convertToUtf8(QLatin1StringView string)
{
    if (Q_UNLIKELY(string.isNull()))
        return QByteArray();

    // create a QByteArray with the worst case scenario size
    QByteArray ba(string.size() * 2, Qt::Uninitialized);
    const qsizetype sz = QUtf8::convertFromLatin1(ba.data(), string) - ba.data();
    ba.truncate(sz);

    return ba;
}